

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objects.hh
# Opt level: O0

void __thiscall discordpp::ForumTag::ForumTag(ForumTag *this,ForumTag *param_1)

{
  ForumTag *param_1_local;
  ForumTag *this_local;
  
  field<discordpp::Snowflake>::field(&this->id,&param_1->id);
  field<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::field
            (&this->name,&param_1->name);
  field<bool>::field(&this->moderated,&param_1->moderated);
  nullable_field<discordpp::Snowflake>::nullable_field(&this->emoji_id,&param_1->emoji_id);
  nullable_field<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  nullable_field(&this->emoji_name,&param_1->emoji_name);
  return;
}

Assistant:

ForumTag(
        field<Snowflake> id = uninitialized,
        field<std::string> name = uninitialized,
        field<bool> moderated = uninitialized,
        nullable_field<Snowflake> emoji_id = uninitialized,
        nullable_field<std::string> emoji_name = uninitialized
    ):
        id(id),
        name(name),
        moderated(moderated),
        emoji_id(emoji_id),
        emoji_name(emoji_name)
    {}